

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<true,duckdb::uhugeint_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  bool bVar7;
  const_reference pvVar8;
  idx_t iVar9;
  SelectionVector *pSVar10;
  uint uVar11;
  idx_t i_1;
  idx_t iVar12;
  ValidityMask *lhs_validity;
  idx_t i;
  idx_t iVar13;
  idx_t local_a8;
  ValidityBytes rhs_mask;
  uhugeint_t local_48;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar8 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar11 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar8;
  if (puVar1 == (unsigned_long *)0x0) {
    local_a8 = 0;
    for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
      iVar12 = iVar13;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar13];
      }
      psVar6 = pSVar2->sel_vector;
      iVar9 = iVar12;
      if (psVar6 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar6[iVar12];
      }
      rhs_mask.validity_mask = *(uchar **)(pdVar4 + iVar12 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.lower = *(uint64_t *)(rhs_mask.validity_mask + vVar5);
      local_48.upper = *(uint64_t *)((long)(rhs_mask.validity_mask + vVar5) + 8);
      if ((uVar11 & rhs_mask.validity_mask[col_idx >> 3]) == 0) {
LAB_019139b4:
        iVar9 = *no_match_count;
        *no_match_count = iVar9 + 1;
        pSVar10 = no_match_sel;
      }
      else {
        bVar7 = uhugeint_t::operator>(&local_48,(uhugeint_t *)(pdVar3 + iVar9 * 0x10));
        if (!bVar7) goto LAB_019139b4;
        iVar9 = local_a8;
        pSVar10 = sel;
        local_a8 = local_a8 + 1;
      }
      pSVar10->sel_vector[iVar9] = (sel_t)iVar12;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  else {
    local_a8 = 0;
    for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
      iVar12 = iVar13;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar13];
      }
      psVar6 = pSVar2->sel_vector;
      iVar9 = iVar12;
      if (psVar6 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar6[iVar12];
      }
      bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar9);
      rhs_mask.validity_mask = *(uchar **)(pdVar4 + iVar12 * 8);
      rhs_mask.capacity =
           ((long)(rhs_layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(rhs_layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      rhs_mask.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.lower = *(uint64_t *)(rhs_mask.validity_mask + vVar5);
      local_48.upper = *(uint64_t *)((long)(rhs_mask.validity_mask + vVar5) + 8);
      if ((bVar7) && ((rhs_mask.validity_mask[col_idx >> 3] & uVar11) != 0)) {
        bVar7 = uhugeint_t::operator>(&local_48,(uhugeint_t *)(pdVar3 + iVar9 * 0x10));
        if (!bVar7) goto LAB_019138d1;
        iVar9 = local_a8;
        pSVar10 = sel;
        local_a8 = local_a8 + 1;
      }
      else {
LAB_019138d1:
        iVar9 = *no_match_count;
        *no_match_count = iVar9 + 1;
        pSVar10 = no_match_sel;
      }
      pSVar10->sel_vector[iVar9] = (sel_t)iVar12;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs_mask.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  return local_a8;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}